

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_sm_length(tcv_t *tcv)

{
  uint local_20;
  byte local_19;
  uchar length;
  tcv_t *tcv_local;
  
  if ((tcv == (tcv_t *)0x0) || (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = 0xfffffffc;
  }
  else {
    local_19 = *(char *)((long)tcv->data + 0xf) * -0x18;
    if (local_19 == 0) {
      local_19 = *(char *)((long)tcv->data + 0x10) * 'd';
    }
    if (local_19 == 0) {
      local_20 = 0xfffffff9;
    }
    else {
      local_20 = (uint)local_19;
    }
    tcv_local._4_4_ = local_20;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_sm_length(tcv_t *tcv)
{
	unsigned char length;

	if (tcv == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Normalize length to meters */
	length = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_LENGTH_SMF_KM] * 1000;

	/* If Km length is 0, try to read from meters unit register */
	if (length == 0)
		length = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_LENGTH_SMF_100M] * 100;


	return length == 0 ? TCV_ERR_SM_LENGTH_NOT_DEFINED : length;
}